

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

int deqp::gles31::Functional::getMinMantissaBits(Precision precision)

{
  int bits [3];
  Precision precision_local;
  
  bits[1] = precision;
  bits[0] = 0x17;
  return bits[(ulong)precision - 2];
}

Assistant:

static int getMinMantissaBits (glu::Precision precision)
{
	const int bits[] =
	{
		7,		// lowp
		10,		// mediump
		23		// highp
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(bits) == glu::PRECISION_LAST);
	DE_ASSERT(de::inBounds<int>(precision, 0, DE_LENGTH_OF_ARRAY(bits)));
	return bits[precision];
}